

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::GetTargetOutputDir_abi_cxx11_
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this)

{
  cmTarget *this_00;
  string *config;
  undefined1 local_38 [8];
  string dir;
  cmNinjaTargetGenerator *this_local;
  
  this_00 = this->Target;
  dir.field_2._8_8_ = this;
  config = GetConfigName_abi_cxx11_(this);
  cmTarget::GetDirectory((string *)local_38,this_00,config,false);
  ConvertToNinjaPath(__return_storage_ptr__,this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetOutputDir() const
{
  std::string dir = this->Target->GetDirectory(this->GetConfigName());
  return ConvertToNinjaPath(dir);
}